

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkStopTests(ARKodeMem ark_mem,sunrealtype tout,N_Vector yout,sunrealtype *tret,int itask,
                int *ier)

{
  double dVar1;
  sunrealtype sVar2;
  int iVar3;
  ARKodeRootMem pAVar4;
  int iVar5;
  char *msgfmt;
  double dVar6;
  double dVar7;
  
  dVar7 = (ABS(ark_mem->h) + ABS(ark_mem->tcur)) * ark_mem->uround * 100.0;
  pAVar4 = ark_mem->root_mem;
  if ((pAVar4 == (ARKodeRootMem)0x0) || (pAVar4->nrtfn < 1)) goto LAB_0014accc;
  iVar5 = pAVar4->irfnd;
  if (iVar5 != 0 && ark_mem->fn_is_current == 0) {
    iVar3 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,1);
    if (iVar3 != 0) {
      iVar5 = -8;
      arkProcessError(ark_mem,-8,0x841,"arkStopTests",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,"At t = %lg, the right-hand side routine failed in an unrecoverable manner.")
      ;
      goto LAB_0014af59;
    }
    ark_mem->fn_is_current = 1;
  }
  iVar3 = arkRootCheck2(ark_mem);
  if (iVar3 == -0xc) {
    tout = ark_mem->root_mem->tlo;
    msgfmt = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
    iVar5 = -0xc;
    iVar3 = 0x854;
  }
  else {
    if (iVar3 == 1) {
      pAVar4 = ark_mem->root_mem;
LAB_0014ac08:
      sVar2 = pAVar4->tlo;
      *tret = sVar2;
      ark_mem->tretlast = sVar2;
      iVar5 = 2;
      goto LAB_0014af59;
    }
    if (iVar3 == 3) {
      tout = ark_mem->root_mem->tlo;
      msgfmt = "Root found at and very near t = %lg.";
      iVar5 = -0x16;
      iVar3 = 0x84d;
    }
    else {
      if (ABS(ark_mem->tcur - ark_mem->tretlast) <= dVar7) {
LAB_0014accc:
        if (ark_mem->tstopset != 0) {
          dVar6 = ark_mem->tstop;
          dVar1 = ark_mem->tcur;
          if (ABS(dVar1 - dVar6) <= dVar7) {
            if ((0.0 <= ark_mem->h * (tout - dVar6)) || (ABS(tout - dVar6) <= dVar7)) {
              if ((ark_mem->tstopinterp == 0) || (ark_mem->interp == (ARKInterp)0x0)) {
                N_VScale(0x3ff0000000000000,ark_mem->yn,yout);
              }
              else {
                iVar5 = ARKodeGetDky(ark_mem,dVar6,0,yout);
                *ier = iVar5;
                if (iVar5 != 0) {
                  iVar5 = -0x16;
                  arkProcessError(ark_mem,-0x16,0x892,"arkStopTests",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                                  ,
                                  "The value tstop = %lg is behind current t = %lg in the direction of integration."
                                  ,ark_mem->tstop,ark_mem->tcur);
                  goto LAB_0014af59;
                }
              }
              sVar2 = ark_mem->tstop;
              *tret = sVar2;
              ark_mem->tretlast = sVar2;
              ark_mem->tstopset = 0;
              iVar5 = 1;
              goto LAB_0014af59;
            }
          }
          else if (0.0 < ((ark_mem->hprime + dVar1) - dVar6) * ark_mem->h) {
            dVar6 = (ark_mem->uround * -4.0 + 1.0) * (dVar6 - dVar1);
            ark_mem->hprime = dVar6;
            ark_mem->eta = dVar6 / ark_mem->h;
          }
        }
        if (itask == 2) {
          dVar6 = ark_mem->tcur;
          if (ABS(dVar6 - ark_mem->tretlast) <= dVar7) {
            return 0;
          }
LAB_0014ae58:
          *tret = dVar6;
          ark_mem->tretlast = dVar6;
          N_VScale(0x3ff0000000000000,ark_mem->yn,yout);
        }
        else {
          if (itask != 1) {
            return 0;
          }
          if ((ark_mem->tcur - tout) * ark_mem->h < 0.0) {
            return 0;
          }
          if (ark_mem->interp == (ARKInterp)0x0) {
            N_VScale(0x3ff0000000000000,ark_mem->yn,yout);
            tout = ark_mem->tcur;
          }
          else {
            iVar5 = ARKodeGetDky(ark_mem,tout,0,yout);
            *ier = iVar5;
            if (iVar5 != 0) {
              msgfmt = 
              "Trouble interpolating at tout = %lg. tout too far back in direction of integration";
              iVar5 = -0x16;
              iVar3 = 0x8b1;
              goto LAB_0014ae24;
            }
          }
          *tret = tout;
          ark_mem->tretlast = tout;
        }
        iVar5 = 0;
        goto LAB_0014af59;
      }
      iVar3 = arkRootCheck3(ark_mem);
      if (iVar3 != -0xc) {
        if (iVar3 == 1) {
          pAVar4 = ark_mem->root_mem;
          pAVar4->irfnd = 1;
          goto LAB_0014ac08;
        }
        if ((iVar3 != 0) || (ark_mem->root_mem->irfnd = 0, itask != 2 || iVar5 != 1))
        goto LAB_0014accc;
        dVar6 = ark_mem->tcur;
        goto LAB_0014ae58;
      }
      tout = ark_mem->root_mem->tlo;
      msgfmt = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
      iVar5 = -0xc;
      iVar3 = 0x87a;
    }
  }
LAB_0014ae24:
  arkProcessError(ark_mem,iVar5,iVar3,"arkStopTests",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt,tout);
LAB_0014af59:
  *ier = iVar5;
  return 1;
}

Assistant:

int arkStopTests(ARKodeMem ark_mem, sunrealtype tout, N_Vector yout,
                 sunrealtype* tret, int itask, int* ier)
{
  int irfndp, retval;
  sunrealtype troundoff;

  /* Estimate an infinitesimal time interval to be used as
     a roundoff for time quantities (based on current time
     and step size) */
  troundoff = FUZZ_FACTOR * ark_mem->uround *
              (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* First, check for a root in the last step taken, other than the
     last root found, if any.  If itask = ARK_ONE_STEP and y(tn) was not
     returned because of an intervening root, return y(tn) now.     */
  if (ark_mem->root_mem != NULL)
  {
    if (ark_mem->root_mem->nrtfn > 0)
    {
      /* Shortcut to roots found in previous step */
      irfndp = ark_mem->root_mem->irfnd;

      /* If the full RHS was not computed in the last call to arkCompleteStep
         and roots were found in the previous step, then compute the full rhs
         for possible use in arkRootCheck2 (not always necessary) */
      if (!(ark_mem->fn_is_current) && irfndp != 0)
      {
        retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                       ark_mem->fn, ARK_FULLRHS_END);
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED);
          *ier = ARK_RHSFUNC_FAIL;
          return (1);
        }
        ark_mem->fn_is_current = SUNTRUE;
      }

      retval = arkRootCheck2((void*)ark_mem);

      if (retval == CLOSERT)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_CLOSE_ROOTS, ark_mem->root_mem->tlo);
        *ier = ARK_ILL_INPUT;
        return (1);
      }
      else if (retval == ARK_RTFUNC_FAIL)
      {
        arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
        *ier = ARK_RTFUNC_FAIL;
        return (1);
      }
      else if (retval == RTFOUND)
      {
        ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
        *ier                      = ARK_ROOT_RETURN;
        return (1);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if (SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff)
      {
        retval = arkRootCheck3((void*)ark_mem);

        if (retval == ARK_SUCCESS)
        { /* no root found */
          ark_mem->root_mem->irfnd = 0;
          if ((irfndp == 1) && (itask == ARK_ONE_STEP))
          {
            ark_mem->tretlast = *tret = ark_mem->tcur;
            N_VScale(ONE, ark_mem->yn, yout);
            *ier = ARK_SUCCESS;
            return (1);
          }
        }
        else if (retval == RTFOUND)
        { /* a new root was found */
          ark_mem->root_mem->irfnd = 1;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          *ier                      = ARK_ROOT_RETURN;
          return (1);
        }
        else if (retval == ARK_RTFUNC_FAIL)
        { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          *ier = ARK_RTFUNC_FAIL;
          return (1);
        }
      }

    } /* end of root stop check */
  }

  /* Test for tn at tstop or near tstop */
  if (ark_mem->tstopset)
  {
    if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
    {
      /* Ensure tout >= tstop, otherwise check for tout return below */
      if ((tout - ark_mem->tstop) * ark_mem->h >= ZERO ||
          SUNRabs(tout - ark_mem->tstop) <= troundoff)
      {
        if (ark_mem->tstopinterp && ark_mem->interp)
        {
          *ier = ARKodeGetDky(ark_mem, ark_mem->tstop, 0, yout);
          if (*ier != ARK_SUCCESS)
          {
            arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                            MSG_ARK_BAD_TSTOP, ark_mem->tstop, ark_mem->tcur);
            *ier = ARK_ILL_INPUT;
            return (1);
          }
        }
        else { N_VScale(ONE, ark_mem->yn, yout); }
        ark_mem->tretlast = *tret = ark_mem->tstop;
        ark_mem->tstopset         = SUNFALSE;
        *ier                      = ARK_TSTOP_RETURN;
        return (1);
      }
    }
    /* If next step would overtake tstop, adjust stepsize */
    else if ((ark_mem->tcur + ark_mem->hprime - ark_mem->tstop) * ark_mem->h >
             ZERO)
    {
      ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
                        (ONE - FOUR * ark_mem->uround);
      ark_mem->eta = ark_mem->hprime / ark_mem->h;
    }
  }

  /* In ARK_NORMAL mode, test if tout was reached */
  if ((itask == ARK_NORMAL) && ((ark_mem->tcur - tout) * ark_mem->h >= ZERO))
  {
    if (ark_mem->interp)
    {
      *ier = ARKodeGetDky(ark_mem, tout, 0, yout);
      if (*ier != ARK_SUCCESS)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_BAD_TOUT, tout);
        *ier = ARK_ILL_INPUT;
        return (1);
      }
      ark_mem->tretlast = *tret = tout;
    }
    else
    {
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tretlast = *tret = ark_mem->tcur;
    }
    *ier = ARK_SUCCESS;
    return (1);
  }

  /* In ARK_ONE_STEP mode, test if tn was returned */
  if (itask == ARK_ONE_STEP &&
      SUNRabs(ark_mem->tcur - ark_mem->tretlast) > troundoff)
  {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, yout);
    *ier = ARK_SUCCESS;
    return (1);
  }

  return (0);
}